

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
multi_agent_planning::InteractionCostCalculator::getInteractingAgents
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,InteractionCostCalculator *this
          ,Edge edge,int time)

{
  code *pcVar1;
  bool bVar2;
  mapped_type *this_00;
  reference __t;
  __tuple_element_t<1UL,_tuple<int,_PlannedAction,_int>_> *p_Var3;
  __tuple_element_t<0UL,_tuple<int,_PlannedAction,_int>_> *__x;
  out_of_range anon_var_0;
  tuple<int,_multi_agent_planning::PlannedAction,_int> *i;
  const_iterator __end2;
  const_iterator __begin2;
  PlannedActionList *__range2;
  PlannedActionList *interactions;
  int time_local;
  InteractionCostCalculator *this_local;
  vector<int,_std::allocator<int>_> *agents;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  this_00 = std::
            map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
            ::at(&this->interactionMap,&edge);
  __end2 = std::
           vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
           ::begin(this_00);
  i = (tuple<int,_multi_agent_planning::PlannedAction,_int> *)
      std::
      vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
      ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
                                *)&i);
    if (!bVar2) break;
    __t = __gnu_cxx::
          __normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
          ::operator*(&__end2);
    p_Var3 = std::get<1ul,int,multi_agent_planning::PlannedAction,int>(__t);
    if (p_Var3->start_time == time) {
      __x = std::get<0ul,int,multi_agent_planning::PlannedAction,int>(__t);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
    ::operator++(&__end2);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

vector<int> InteractionCostCalculator::getInteractingAgents(Edge edge, int time) const {
	vector<int> agents;

	try {
		const PlannedActionList& interactions = interactionMap.at(edge);

		for (auto const& i : interactions) {
			if (get<1>(i).start_time == time) {
				//cout << get<0>(i) << " " << get<1>(i).edge << endl;
				agents.push_back(get<0>(i));
			}
		}
	}
	catch (std::out_of_range) {
		return agents;
	}

}